

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# media_test.cpp
# Opt level: O2

void __thiscall HenyeyGreenstein_Normalized_Test::TestBody(HenyeyGreenstein_Normalized_Test *this)

{
  char *message;
  float fVar1;
  float fVar2;
  float fVar3;
  Float FVar4;
  undefined1 auVar5 [64];
  Vector3f wo;
  Vector3f wi;
  char *in_stack_ffffffffffffff28;
  HGPhaseFunction hg;
  AssertionResult gtest_ar;
  double val1;
  Point2f u;
  Stratified2DIter __begin2;
  Stratified2DIter __end2;
  RNG rng;
  undefined1 extraout_var [56];
  
  rng.state = 0x853c49e6748fea9b;
  rng.inc = 0xda3e39cb94b95bdb;
  for (fVar1 = -0.75; fVar1 <= 0.75; fVar1 = fVar1 + 0.25) {
    hg.g = fVar1;
    fVar2 = pbrt::RNG::Uniform<float>(&rng);
    gtest_ar._4_4_ = pbrt::RNG::Uniform<float>(&rng);
    gtest_ar._0_4_ = fVar2;
    wo = pbrt::SampleUniformSphere((Point2f *)&gtest_ar);
    gtest_ar.success_ = false;
    gtest_ar._1_3_ = 0x10;
    gtest_ar.message_.ptr_ =
         (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
    val1 = -1.9023773406914138e-283;
    pbrt::detail::IndexingGenerator<pbrt::Stratified2D,_pbrt::detail::Stratified2DIter>::begin
              (&__begin2,
               (IndexingGenerator<pbrt::Stratified2D,_pbrt::detail::Stratified2DIter> *)&gtest_ar);
    pbrt::detail::IndexingGenerator<pbrt::Stratified2D,_pbrt::detail::Stratified2DIter>::end
              (&__end2,(IndexingGenerator<pbrt::Stratified2D,_pbrt::detail::Stratified2DIter> *)
                       &gtest_ar);
    fVar3 = 0.0;
    for (; __begin2.super_RNGIterator<pbrt::detail::Stratified2DIter>.
           super_IndexingIterator<pbrt::detail::Stratified2DIter>.i !=
           __end2.super_RNGIterator<pbrt::detail::Stratified2DIter>.
           super_IndexingIterator<pbrt::detail::Stratified2DIter>.i;
        __begin2.super_RNGIterator<pbrt::detail::Stratified2DIter>.
        super_IndexingIterator<pbrt::detail::Stratified2DIter>.i =
             __begin2.super_RNGIterator<pbrt::detail::Stratified2DIter>.
             super_IndexingIterator<pbrt::detail::Stratified2DIter>.i + 1) {
      auVar5._0_8_ = pbrt::detail::Stratified2DIter::operator*(&__begin2);
      auVar5._8_56_ = extraout_var;
      u.super_Tuple2<pbrt::Point2,_float> = (Tuple2<pbrt::Point2,_float>)vmovlps_avx(auVar5._0_16_);
      wi = pbrt::SampleUniformSphere(&u);
      FVar4 = pbrt::HGPhaseFunction::p(&hg,wo,wi);
      fVar3 = fVar3 + FVar4;
      fVar2 = fVar3;
    }
    testing::internal::DoubleNearPredFormat
              ((char *)CONCAT44(fVar1,fVar2),in_stack_ffffffffffffff28,(char *)0x2ed0b4,val1,
               (double)gtest_ar.message_.ptr_,(double)CONCAT44(gtest_ar._4_4_,gtest_ar._0_4_));
    if (gtest_ar.success_ == false) {
      testing::Message::Message((Message *)&__begin2);
      message = "";
      if (gtest_ar.message_.ptr_ !=
          (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
        message = ((gtest_ar.message_.ptr_)->_M_dataplus)._M_p;
      }
      testing::internal::AssertHelper::AssertHelper
                ((AssertHelper *)&__end2,kNonFatalFailure,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/mmp[P]pbrt-v4-ci-testing/src/pbrt/media_test.cpp"
                 ,0x4e,message);
      testing::internal::AssertHelper::operator=((AssertHelper *)&__end2,(Message *)&__begin2);
      testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&__end2);
      testing::internal::
      scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
      ::~scoped_ptr((scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
                     *)&__begin2);
    }
    testing::internal::
    scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
    ~scoped_ptr(&gtest_ar.message_);
  }
  return;
}

Assistant:

TEST(HenyeyGreenstein, Normalized) {
    RNG rng;
    for (float g = -.75; g <= 0.75; g += 0.25) {
        HGPhaseFunction hg(g);
        Vector3f wo = SampleUniformSphere({rng.Uniform<Float>(), rng.Uniform<Float>()});
        Float sum = 0;
        int sqrtSamples = 64;
        int nSamples = sqrtSamples * sqrtSamples;
        for (Point2f u : Stratified2D(sqrtSamples, sqrtSamples)) {
            Vector3f wi = SampleUniformSphere(u);
            sum += hg.p(wo, wi);
        }
        // Phase function should integrate to 1/4pi.
        EXPECT_NEAR(sum / nSamples, 1. / (4. * Pi), 1e-3f);
    }
}